

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O1

bool __thiscall Assimp::RemoveVCProcess::ProcessMesh(RemoveVCProcess *this,aiMesh *pMesh)

{
  uint uVar1;
  aiBone *paVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint real;
  int iVar7;
  uint i;
  uint uVar8;
  uint real_1;
  ulong uVar9;
  
  if ((this->configDeleteFlags & 0x800) != 0) {
    pMesh->mMaterialIndex = 0;
  }
  if (((this->configDeleteFlags & 2) == 0) || (pMesh->mNormals == (aiVector3D *)0x0)) {
    bVar3 = false;
  }
  else {
    operator_delete__(pMesh->mNormals);
    pMesh->mNormals = (aiVector3D *)0x0;
    bVar3 = true;
  }
  if (((this->configDeleteFlags & 4) != 0) && (pMesh->mTangents != (aiVector3D *)0x0)) {
    operator_delete__(pMesh->mTangents);
    pMesh->mTangents = (aiVector3D *)0x0;
    if (pMesh->mBitangents != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mBitangents);
    }
    pMesh->mBitangents = (aiVector3D *)0x0;
    bVar3 = true;
  }
  uVar1 = this->configDeleteFlags;
  iVar7 = 0;
  uVar8 = 0;
  do {
    if (pMesh->mTextureCoords[uVar8] == (aiVector3D *)0x0) break;
    if ((0x2000000 << ((byte)iVar7 & 0x1f) & this->configDeleteFlags) == 0 && (uVar1 & 0x10) == 0) {
LAB_003dd5c1:
      uVar8 = uVar8 + 1;
    }
    else {
      operator_delete__(pMesh->mTextureCoords[uVar8]);
      pMesh->mTextureCoords[uVar8] = (aiVector3D *)0x0;
      bVar3 = true;
      if ((uVar1 & 0x10) != 0) goto LAB_003dd5c1;
      if (uVar8 + 1 < 8) {
        lVar6 = (ulong)(uVar8 + 1) + 0xe;
        uVar5 = uVar8;
        do {
          pMesh->mTextureCoords[uVar5] = (aiVector3D *)pMesh->mColors[lVar6 + -6];
          uVar5 = uVar5 + 1;
          iVar4 = (int)lVar6;
          lVar6 = lVar6 + 1;
        } while (iVar4 != 0x15);
      }
      pMesh->mTextureCoords[7] = (aiVector3D *)0x0;
      bVar3 = true;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 8);
  uVar1 = this->configDeleteFlags;
  iVar7 = 0;
  uVar8 = 0;
  do {
    if (pMesh->mColors[uVar8] == (aiColor4D *)0x0) break;
    if ((1 << ((char)uVar8 + 0x14U & 0x1f) & this->configDeleteFlags) == 0 && (uVar1 & 8) == 0) {
LAB_003dd652:
      uVar8 = uVar8 + 1;
    }
    else {
      operator_delete__(pMesh->mColors[uVar8]);
      pMesh->mColors[uVar8] = (aiColor4D *)0x0;
      bVar3 = true;
      if ((uVar1 & 8) != 0) goto LAB_003dd652;
      if (uVar8 + 1 < 8) {
        lVar6 = (ulong)(uVar8 + 1) + 6;
        uVar5 = uVar8;
        do {
          pMesh->mColors[uVar5] = pMesh->mColors[lVar6 + -6];
          uVar5 = uVar5 + 1;
          iVar4 = (int)lVar6;
          lVar6 = lVar6 + 1;
        } while (iVar4 != 0xd);
      }
      pMesh->mColors[7] = (aiColor4D *)0x0;
      bVar3 = true;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 8);
  if (((this->configDeleteFlags & 0x20) != 0) && (pMesh->mBones != (aiBone **)0x0)) {
    if (pMesh->mNumBones != 0) {
      uVar9 = 0;
      do {
        paVar2 = pMesh->mBones[uVar9];
        if (paVar2 != (aiBone *)0x0) {
          if (paVar2->mWeights != (aiVertexWeight *)0x0) {
            operator_delete__(paVar2->mWeights);
          }
          operator_delete(paVar2,0x460);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < pMesh->mNumBones);
    }
    if (pMesh->mBones != (aiBone **)0x0) {
      operator_delete__(pMesh->mBones);
    }
    pMesh->mBones = (aiBone **)0x0;
    pMesh->mNumBones = 0;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool RemoveVCProcess::ProcessMesh(aiMesh* pMesh)
{
    bool ret = false;

    // if all materials have been deleted let the material
    // index of the mesh point to the created default material
    if ( configDeleteFlags & aiComponent_MATERIALS)
        pMesh->mMaterialIndex = 0;

    // handle normals
    if (configDeleteFlags & aiComponent_NORMALS && pMesh->mNormals)
    {
        delete[] pMesh->mNormals;
        pMesh->mNormals = NULL;
        ret = true;
    }

    // handle tangents and bitangents
    if (configDeleteFlags & aiComponent_TANGENTS_AND_BITANGENTS && pMesh->mTangents)
    {
        delete[] pMesh->mTangents;
        pMesh->mTangents = NULL;

        delete[] pMesh->mBitangents;
        pMesh->mBitangents = NULL;
        ret = true;
    }

    // handle texture coordinates
    bool b = (0 != (configDeleteFlags & aiComponent_TEXCOORDS));
    for (unsigned int i = 0, real = 0; real < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++real)
    {
        if (!pMesh->mTextureCoords[i])break;
        if (configDeleteFlags & aiComponent_TEXCOORDSn(real) || b)
        {
            delete [] pMesh->mTextureCoords[i];
            pMesh->mTextureCoords[i] = NULL;
            ret = true;

            if (!b)
            {
                // collapse the rest of the array
                for (unsigned int a = i+1; a < AI_MAX_NUMBER_OF_TEXTURECOORDS;++a)
                    pMesh->mTextureCoords[a-1] = pMesh->mTextureCoords[a];

                pMesh->mTextureCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS-1] = NULL;
                continue;
            }
        }
        ++i;
    }

    // handle vertex colors
    b = (0 != (configDeleteFlags & aiComponent_COLORS));
    for (unsigned int i = 0, real = 0; real < AI_MAX_NUMBER_OF_COLOR_SETS; ++real)
    {
        if (!pMesh->mColors[i])break;
        if (configDeleteFlags & aiComponent_COLORSn(i) || b)
        {
            delete [] pMesh->mColors[i];
            pMesh->mColors[i] = NULL;
            ret = true;

            if (!b)
            {
                // collapse the rest of the array
                for (unsigned int a = i+1; a < AI_MAX_NUMBER_OF_COLOR_SETS;++a)
                    pMesh->mColors[a-1] = pMesh->mColors[a];

                pMesh->mColors[AI_MAX_NUMBER_OF_COLOR_SETS-1] = NULL;
                continue;
            }
        }
        ++i;
    }

    // handle bones
    if (configDeleteFlags & aiComponent_BONEWEIGHTS && pMesh->mBones)
    {
        ArrayDelete(pMesh->mBones,pMesh->mNumBones);
        ret = true;
    }
    return ret;
}